

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm.c
# Opt level: O0

void emit_bcdef(BuildCtx *ctx)

{
  int local_14;
  int i;
  BuildCtx *ctx_local;
  
  fprintf((FILE *)ctx->fp,"/* This is a generated file. DO NOT EDIT! */\n\n");
  fprintf((FILE *)ctx->fp,"LJ_DATADEF const uint16_t lj_bc_ofs[] = {\n");
  for (local_14 = 0; local_14 < ctx->npc; local_14 = local_14 + 1) {
    if (local_14 != 0) {
      fprintf((FILE *)ctx->fp,",\n");
    }
    fprintf((FILE *)ctx->fp,"%d",(ulong)(uint)ctx->bc_ofs[local_14]);
  }
  return;
}

Assistant:

static void emit_bcdef(BuildCtx *ctx)
{
  int i;
  fprintf(ctx->fp, "/* This is a generated file. DO NOT EDIT! */\n\n");
  fprintf(ctx->fp, "LJ_DATADEF const uint16_t lj_bc_ofs[] = {\n");
  for (i = 0; i < ctx->npc; i++) {
    if (i != 0)
      fprintf(ctx->fp, ",\n");
    fprintf(ctx->fp, "%d", ctx->bc_ofs[i]);
  }
}